

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O1

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile(SOLReader2<mp::SOLHandler_Easy> *this,string *name)

{
  uiolen *__ptr;
  char **__endptr;
  uiolen uVar1;
  uint uVar2;
  NLSolution *pNVar3;
  bool bVar4;
  NLW2_SOLReadResultCode NVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  size_t sVar8;
  uint *puVar9;
  size_t sVar10;
  NLHeader *pNVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  string *psVar15;
  char *pcVar16;
  size_type sVar17;
  char *pcVar18;
  ulong __size;
  uiolen *__ptr_00;
  double dVar19;
  AMPLOptions ao;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  double local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  uiolen *local_38;
  
  pcVar18 = (name->_M_dataplus)._M_p;
  this->stub_ = pcVar18;
  __stream = fopen(pcVar18,"rb");
  this->internal_rv_ = 0x3e5;
  if (__stream == (FILE *)0x0) {
    serror(this,"can\'t open \'%s\'",this->stub_);
    this->internal_rv_ = 0x3e6;
    NVar5 = NLW2_SOLRead_Fail_Open;
    goto LAB_0010db6c;
  }
  __ptr = &this->L;
  sVar7 = fread(__ptr,4,1,__stream);
  if ((sVar7 != 0) && (this->L == 6)) {
    this->binary = 1;
    sVar7 = fread(this->buf,6,1,__stream);
    if ((sVar7 != 0) &&
       (((*(short *)(this->buf + 4) == 0x7972 && *(int *)this->buf == 0x616e6962 &&
         (sVar7 = fread(__ptr,4,1,__stream), sVar7 != 0)) && (*__ptr == 6)))) goto LAB_0010d683;
    goto LAB_0010d634;
  }
  this->binary = 0;
  rewind(__stream);
LAB_0010d683:
  this->need_vbtol = 0;
  this->have_options = 0;
  this->bs = 1;
  this->nbs = 0;
  if (this->binary == 0) {
    pcVar18 = this->buf;
    pcVar16 = fgets(pcVar18,0x200,__stream);
    if (pcVar16 != (char *)0x0) {
      __endptr = &this->se;
      psVar15 = &this->solve_msg_;
      local_38 = (uiolen *)this->buf;
      pcVar16 = pcVar18;
LAB_0010da2f:
      do {
        *__endptr = pcVar16;
        if (*pcVar16 != '\0') {
          if ((*pcVar16 != '\r') || (pcVar16[1] != '\n')) {
            pcVar16 = pcVar16 + 1;
            goto LAB_0010da2f;
          }
          *pcVar16 = '\n';
          pcVar16 = *__endptr;
          *__endptr = pcVar16 + 1;
          pcVar16[1] = '\0';
        }
        if (*pcVar18 == '\n') goto LAB_0010db8a;
        sVar8 = (long)this->se - (long)pcVar18;
        this->n1 = sVar8;
        this->b1 = pcVar18;
        if ((*pcVar18 == '\b') && (this->bs != 0)) {
          this->n = sVar8;
          sVar10 = this->n1;
          pcVar16 = this->b1;
          pcVar13 = (char *)((long)local_38 + (sVar10 - (long)this->se));
          do {
            sVar10 = sVar10 - 1;
            pcVar16 = pcVar16 + 1;
            this->n1 = sVar10;
            if (sVar10 == 0) {
              this->nbs = this->nbs + sVar8;
              goto LAB_0010db1e;
            }
            this->b1 = pcVar16;
            pcVar13 = pcVar13 + -1;
          } while (*pcVar16 == '\b');
          this->nbs = this->nbs - (long)pcVar13;
          if (sVar10 != 0) {
            this->bs = 0;
            goto LAB_0010daf7;
          }
        }
        else {
LAB_0010daf7:
          std::__cxx11::string::append((char *)psVar15,(ulong)this->b1);
        }
LAB_0010db1e:
        pcVar13 = fgets(pcVar18,0x200,__stream);
        pcVar16 = pcVar18;
      } while (pcVar13 != (char *)0x0);
    }
    pcVar18 = this->stub_;
    puVar9 = (uint *)__errno_location();
    serror(this,"error reading \'%s\' (errno=%d)",pcVar18,(ulong)*puVar9);
LAB_0010db5c:
    this->readresult_ = NLW2_SOLRead_Early_EOF;
    NVar5 = NLW2_SOLRead_Early_EOF;
    goto LAB_0010db6c;
  }
  pcVar18 = this->buf;
  psVar15 = (string *)0x200;
  do {
    sVar7 = fread(__ptr,4,1,__stream);
    if (sVar7 == 0) goto LAB_0010e568;
    uVar1 = this->L;
    this->L1 = uVar1;
    while (uVar1 != 0) {
      uVar2 = this->L;
      sVar7 = 0x200;
      if (uVar2 < 0x200) {
        sVar7 = (size_t)uVar2;
      }
      this->n = sVar7;
      this->L = uVar2 - (int)sVar7;
      sVar7 = fread(pcVar18,sVar7,1,__stream);
      if (sVar7 == 0) {
        pcVar18 = this->stub_;
        puVar9 = (uint *)__errno_location();
        serror(this,"error reading \'%s\' (errno=%d)",pcVar18,(ulong)*puVar9);
        goto LAB_0010db5c;
      }
      if (*__ptr == 0) {
        sVar8 = this->n;
        do {
          sVar10 = sVar8;
          sVar8 = sVar10 - 1;
          if (sVar8 == 0xffffffffffffffff) goto LAB_0010d771;
          this->n = sVar8;
        } while (this->buf[sVar10 - 1] == ' ');
        this->n = sVar10;
      }
LAB_0010d771:
      this->b1 = pcVar18;
      sVar8 = this->n;
      this->n1 = sVar8;
      if ((this->buf[0] == '\b') && (this->bs != 0)) {
        sVar10 = this->n1;
        pcVar16 = this->b1;
        lVar12 = sVar10 - sVar8;
        do {
          sVar10 = sVar10 - 1;
          pcVar16 = pcVar16 + 1;
          this->n1 = sVar10;
          if (sVar10 == 0) {
            this->nbs = this->nbs + sVar8;
            goto LAB_0010d80d;
          }
          this->b1 = pcVar16;
          lVar12 = lVar12 + -1;
        } while (*pcVar16 == '\b');
        this->nbs = this->nbs - lVar12;
        if (sVar10 != 0) {
          this->bs = 0;
          goto LAB_0010d7ee;
        }
      }
      else {
LAB_0010d7ee:
        std::__cxx11::string::append((char *)&this->solve_msg_,(ulong)this->b1);
      }
LAB_0010d80d:
      uVar1 = *__ptr;
    }
    sVar7 = fread(__ptr,4,1,__stream);
    if (sVar7 == 0) goto LAB_0010e568;
    if (this->L != this->L1) goto LAB_0010d634;
  } while (this->L != 0);
  this->L1 = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons << 3;
  sVar7 = fread(__ptr,4,1,__stream);
  if (sVar7 == 0) {
LAB_0010e568:
    NVar5 = ReportEarlyEof(this);
    goto LAB_0010db6c;
  }
  uVar2 = this->L - 0x27;
  this->L2 = uVar2;
  if ((uVar2 & 3) == 0 && uVar2 < 0x19) {
    sVar7 = fread(pcVar18,7,1,__stream);
    if (sVar7 != 0) {
      if (*(int *)(this->buf + 3) != 0x736e6f69 || *(int *)pcVar18 != 0x6974704f) goto LAB_0010d634;
      sVar7 = fread(this->Options,4,4,__stream);
      if (sVar7 != 0) {
        iVar6 = this->Options[0];
        this->nOpts = iVar6;
        if (iVar6 - 10U < 0xfffffff9) goto LAB_0010dc6d;
        if (this->Options[2] == 3) {
          this->nOpts = iVar6 + -2;
          this->need_vbtol = 1;
        }
        sVar7 = fread(this->Options + 4,4,(long)this->nOpts + 1,__stream);
        if ((sVar7 != 0) &&
           ((this->need_vbtol == 0 || (sVar7 = fread(&this->vbtol,8,1,__stream), sVar7 != 0)))) {
          sVar7 = fread(&this->L2,4,1,__stream);
          if ((sVar7 != 0) && (*__ptr == this->L2)) {
            this->have_options = 1;
            goto LAB_0010dcc1;
          }
          goto LAB_0010d634;
        }
      }
    }
    goto LAB_0010e568;
  }
  if (this->L == this->L1) goto LAB_0010dcc1;
  goto LAB_0010d634;
LAB_0010db8a:
  do {
    do {
      iVar6 = getc(__stream);
      this->j = iVar6;
    } while (iVar6 == 10);
  } while (iVar6 == 0xd);
  if (iVar6 == 0x4f) {
    pcVar16 = fgets(pcVar18,0x200,__stream);
    if (pcVar16 == (char *)0x0) goto LAB_0010e568;
    if (*(short *)(this->buf + 4) != 0x736e || *(int *)pcVar18 != 0x6f697470) goto LAB_0010dcc1;
    this->have_options = 1;
    this->j = 0;
    do {
      pcVar16 = fgets(pcVar18,0x200,__stream);
      if (pcVar16 == (char *)0x0) goto LAB_0010e568;
      lVar12 = strtol(pcVar18,__endptr,10);
      this->Options[this->j] = (Long)lVar12;
      if (this->se == pcVar18) {
        local_78._0_8_ = local_78 + 0x10;
        sVar7 = strlen(pcVar18);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
        goto LAB_0010e423;
      }
      iVar6 = this->j;
      this->j = iVar6 + 1;
    } while (iVar6 < 3);
    iVar6 = this->Options[0];
    this->nOpts = iVar6;
    if (iVar6 - 10U < 0xfffffff9) {
LAB_0010dc6d:
      serror(this,"expected nOpts between 3 and 9; got %d: ",(ulong)(uint)this->nOpts);
      goto LAB_0010d634;
    }
    if (this->Options[2] == 3) {
      this->nOpts = iVar6 + -2;
      this->need_vbtol = 1;
    }
    this->je = this->nOpts + 5;
    this->j = 4;
    if (-1 < this->nOpts) {
      do {
        pcVar16 = fgets(pcVar18,0x200,__stream);
        if (pcVar16 == (char *)0x0) goto LAB_0010e568;
        lVar12 = strtol(pcVar18,__endptr,10);
        this->Options[this->j] = (Long)lVar12;
        if (this->se == pcVar18) {
          local_78._0_8_ = local_78 + 0x10;
          sVar7 = strlen(pcVar18);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,pcVar18,pcVar18 + sVar7);
          serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
          goto LAB_0010e423;
        }
        iVar6 = this->j + 1;
        this->j = iVar6;
      } while (iVar6 < this->je);
    }
    if (this->need_vbtol == 0) goto LAB_0010dcc1;
    pcVar16 = fgets(pcVar18,0x200,__stream);
    if (pcVar16 == (char *)0x0) goto LAB_0010e568;
    dVar19 = strtod(pcVar18,__endptr);
    this->vbtol = dVar19;
    if (this->se != pcVar18) goto LAB_0010dcc1;
    local_78._0_8_ = local_78 + 0x10;
    sVar7 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
    serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
LAB_0010e423:
    this->readresult_ = NLW2_SOLRead_Bad_Line;
    if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) goto LAB_0010e3be;
  }
  else {
    ungetc(iVar6,__stream);
LAB_0010dcc1:
    if (this->nbs != 0) {
      pcVar16 = (this->solve_msg_)._M_dataplus._M_p;
      sVar17 = (this->solve_msg_)._M_string_length;
      pcVar18 = pcVar16 + sVar17;
      pcVar13 = pcVar16;
      for (pcVar14 = pcVar16; (sVar17 != 0 && (pcVar13 = pcVar14, *pcVar14 == '\b'));
          pcVar14 = pcVar14 + 1) {
        sVar17 = sVar17 - 1;
        pcVar13 = pcVar18;
      }
      if (pcVar18 == pcVar13) {
        (this->solve_msg_)._M_string_length = 0;
        *pcVar16 = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&this->solve_msg_,0);
      }
    }
    if ((this->solve_msg_)._M_string_length != 0) {
      if (this->binary != 0) {
        std::__cxx11::string::append((char *)&this->solve_msg_);
      }
      pcVar18 = (this->solve_msg_)._M_dataplus._M_p;
      pNVar3 = this->solh_->sol_;
      pNVar3->nbs_ = (int)this->nbs;
      psVar15 = (string *)(pNVar3->solve_message_)._M_string_length;
      strlen(pcVar18);
      std::__cxx11::string::_M_replace
                ((ulong)&pNVar3->solve_message_,0,(char *)psVar15,(ulong)pcVar18);
    }
    NVar5 = (NLW2_SOLReadResultCode)psVar15;
    if (this->have_options == 0) {
      this->j = (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
    }
    else {
      this->z = this->Options + (long)this->nOpts + 1;
      this->internal_rv_ = 0x3e4;
      local_78._0_8_ = (FILE *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      std::vector<long,std::allocator<long>>::_M_assign_aux<int*>
                ((vector<long,std::allocator<long>> *)local_78,this->Options,
                 this->Options + (long)this->nOpts + 5);
      local_60._M_p._0_1_ = this->need_vbtol != 0;
      local_58 = this->vbtol;
      iVar6 = this->z[3];
      this->j = iVar6;
      this->internal_rv_ = 0x3e5;
      if (iVar6 < 0 || (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars < iVar6) {
        pcVar18 = "Wrong NumVars %d, expected 0..%d: ";
LAB_0010de6c:
        serror(this,pcVar18);
LAB_0010de76:
        NVar5 = ReportBadFormat(this);
LAB_0010de7e:
        bVar4 = false;
      }
      else {
        iVar6 = this->z[1];
        this->j = iVar6;
        if (iVar6 < 0 ||
            (this->hdr_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons < iVar6) {
          pcVar18 = "Wrong NumAlgCons %d, expected 0..%d: ";
          goto LAB_0010de6c;
        }
        NVar5 = NLW2_SOLRead_Bad_Options;
        bVar4 = true;
        if (this->binary != 0) {
          this->L1 = iVar6 << 3;
          sVar7 = fread(__ptr,4,1,__stream);
          if (sVar7 != 0) {
            if (this->L == this->L1) goto LAB_0010de83;
            goto LAB_0010de76;
          }
          NVar5 = ReportEarlyEof(this);
          goto LAB_0010de7e;
        }
      }
LAB_0010de83:
      if ((FILE *)local_78._0_8_ != (FILE *)0x0) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
      }
      if (!bVar4) goto LAB_0010db6c;
    }
    if (this->j != 0) {
      local_78._12_4_ = this->j;
      local_78._8_4_ = this->binary;
      local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
      local_58 = 0.0;
      local_50._M_local_buf[0] = '\0';
      local_78._0_8_ = __stream;
      local_60._M_p = (pointer)&local_50;
      SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
                (this->solh_,(VecReader<double> *)local_78);
      bVar4 = CheckReader<mp::VecReader<double>>
                        (this,(VecReader<double> *)local_78,&this->readresult_);
      if (!bVar4) {
        NVar5 = this->readresult_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p,
                        CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar4) goto LAB_0010db6c;
    }
    pNVar11 = &this->hdr_;
    if (this->have_options != 0) {
      pNVar11 = (NLHeader *)(this->z + 3);
    }
    uVar2 = (pNVar11->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
    this->nsv = uVar2;
    this->i = uVar2;
    this->sstatus_seen = 0;
    if (this->binary != 0) {
      sVar7 = fread(__ptr,4,1,__stream);
      if ((sVar7 != 0) && (this->L == this->L1)) {
        this->L1 = this->i << 3;
        sVar7 = fread(__ptr,4,1,__stream);
        if ((sVar7 != 0) && (__ptr_00 = &this->L1, *__ptr == *__ptr_00)) {
          if (this->i != 0) {
            local_78._12_4_ = this->i;
            local_78._8_4_ = this->binary;
            local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
            local_58 = 0.0;
            local_50._M_local_buf[0] = '\0';
            local_78._0_8_ = __stream;
            local_60._M_p = (pointer)&local_50;
            local_38 = __ptr_00;
            SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                      (this->solh_,(VecReader<double> *)local_78);
            bVar4 = CheckReader<mp::VecReader<double>>
                              (this,(VecReader<double> *)local_78,&this->readresult_);
            __ptr_00 = local_38;
            if (!bVar4) {
              NVar5 = this->readresult_;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_p != &local_50) {
              operator_delete(local_60._M_p,
                              CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]
                                      ) + 1);
            }
            if (!bVar4) goto LAB_0010db6c;
          }
          sVar7 = fread(__ptr,4,1,__stream);
          if ((sVar7 != 0) && (*__ptr == *__ptr_00)) {
            sVar7 = fread(__ptr,4,1,__stream);
            if (sVar7 == 0) goto LAB_0010e3d5;
            __size = (ulong)*__ptr;
            if ((__size == 8) || (*__ptr == 4)) {
              this->ui = __size;
              sVar7 = fread(this->Objno,__size,1,__stream);
              if ((sVar7 == 1) &&
                 ((sVar7 = fread(__ptr_00,4,1,__stream), sVar7 == 1 &&
                  (uVar1 = *__ptr, uVar1 == *__ptr_00)))) {
                this->objno = this->Objno[0];
                this->solh_->sol_->solve_result_ = this->Objno[1];
                if ((uVar1 == 8) &&
                   (NVar5 = bsufread(this,(FILE *)__stream), NVar5 != NLW2_SOLRead_OK))
                goto LAB_0010e2d9;
                do {
                  sVar7 = fread(__ptr,4,1,__stream);
                } while (sVar7 != 0);
                goto LAB_0010e3d5;
              }
            }
          }
        }
      }
LAB_0010d634:
      NVar5 = ReportBadFormat(this);
      goto LAB_0010db6c;
    }
    if (uVar2 != 0) {
      local_78._8_8_ = (ulong)uVar2 << 0x20;
      local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
      local_58 = 0.0;
      local_50._M_local_buf[0] = '\0';
      local_78._0_8_ = __stream;
      local_60._M_p = (pointer)&local_50;
      SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                (this->solh_,(VecReader<double> *)local_78);
      bVar4 = CheckReader<mp::VecReader<double>>
                        (this,(VecReader<double> *)local_78,&this->readresult_);
      if (!bVar4) {
        NVar5 = this->readresult_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p,
                        CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar4) goto LAB_0010db6c;
    }
    pcVar18 = this->buf;
    pcVar16 = fgets(pcVar18,0x200,__stream);
    if (pcVar16 == (char *)0x0) {
LAB_0010e3d5:
      this->internal_rv_ = 0;
      NVar5 = NLW2_SOLRead_OK;
      goto LAB_0010db6c;
    }
    if (*(short *)(this->buf + 4) == 0x206f && *(int *)pcVar18 == 0x6e6a626f) {
      this->s = this->buf + 6;
      dVar19 = strtod(this->buf + 6,&this->se);
      this->x = dVar19;
      pcVar16 = this->se;
      if (this->s < pcVar16) {
        this->objno = (int)dVar19;
        this->s = pcVar16;
        dVar19 = strtod(pcVar16,&this->se);
        this->x = dVar19;
        if (this->s < this->se) {
          this->Objno[1] = (int)dVar19;
          this->solh_->sol_->solve_result_ = (int)dVar19;
          NVar5 = gsufread(this,(FILE *)__stream);
          if (NVar5 != NLW2_SOLRead_OK) {
LAB_0010e2d9:
            if (NVar5 == NLW2_SOLRead_Bad_Suffix) {
              NVar5 = NLW2_SOLRead_Bad_Suffix;
              serror(this,"Bad suffix in \'%s\'\n",this->stub_);
            }
            else {
              NVar5 = this->readresult_;
            }
            goto LAB_0010db6c;
          }
        }
        goto LAB_0010e3d5;
      }
    }
    local_78._0_8_ = (FILE *)(local_78 + 0x10);
    sVar7 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar18,pcVar18 + sVar7);
    serror(this,"Bad line in \'%s\': %s",this->stub_,local_78._0_8_);
    this->readresult_ = NLW2_SOLRead_Bad_Line;
    if ((FILE *)local_78._0_8_ != (FILE *)(local_78 + 0x10)) {
LAB_0010e3be:
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  NVar5 = NLW2_SOLRead_Bad_Line;
LAB_0010db6c:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return NVar5;
}

Assistant:

NLW2_SOLReadResultCode
SOLReader2<SOLHandler>::ReadSOLFile(
    const std::string& name) {
  File file;
  stub_ = name.c_str();

  file.Open(stub_, "rb");
  internal_rv_ = 997;
  if (!file) {
    serror("can't open '%s'", stub_);
    internal_rv_ = 998;
    return NLW2_SOLRead_Fail_Open;
  }
  FILE* f = file.GetHandle();
  if (fread((char *)&L, sizeof(uiolen), 1, f)
      && L == 6) {
    /* binary files may be written by Fortran unformatted writes */
    binary = 1;
    if (!fread(buf, 6, 1, f)
        || strncmp(buf,"binary",6)
        || !fread((char *)&L, sizeof(uiolen), 1, f)
        || L != 6) {
      return ReportBadFormat();
    }
  }
  else {
    binary = 0;
    rewind(f);
  }
  have_options = need_vbtol = 0;
  bs = 1;	/* omit initial backspaces */
  nbs = 0; /* number of backspaces omitted */
  if (binary) {     /////////////// BINARY FORMAT //////////
    for(;;) {       /////////////// SOLVE MESSAGE //////////
      if (!fread((char *)&L,sizeof(uiolen),1,f))
        return ReportEarlyEof();
      if ((L1 = L)) {
        do {
          n = L < sizeof(buf) ? (int)L : (int)sizeof(buf);
          L -= n;
          if (!fread(buf, n, 1, f))
            return ReportEarlyEof();
          if (!L) {
            while(n > 0) {
              if (buf[--n] != ' ') {
                ++n;
                break;
              }
            }
          }
          b1 = buf;
          n1 = n;
          if (buf[0] == '\b' && bs) {
            while(--n1 > 0
                  && *++b1 == '\b');
            nbs += n - n1;
            if (n1 > 0)
              bs = 0;
            else
              continue;
          }
          solve_msg_.append(b1, n1);
        }
        while(L);
      }
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
      if (!L)
        break;
    }
		L1 = NumAlgCons() * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f))
      return ReportEarlyEof();
    L2 = L - (8*sizeof(Long) + 7);
    if (L2 <= 4*sizeof(Long) + sizeof(real)
        && !(L2 & (sizeof(Long)-1))) {
      /////////////// check for Options ///////////////
      if (!fread(buf, 7, 1, f))
        return ReportEarlyEof();
      if (strncmp(buf, "Options", 7))
        return ReportBadFormat();
      if (!fread((char *)Options, sizeof(Long), 4, f))
        return ReportEarlyEof();
      nOpts = Options[0];
      if (nOpts < 3 || nOpts > 9) {
bad_nOpts:
        serror(
              "expected nOpts between 3 and 9; got %d: ",
              nOpts);
        return ReportBadFormat();
      }
      if (Options[2] == 3) {
        nOpts -= 2;
        need_vbtol = 1;
      }
      if (!fread((char *)(Options+4), sizeof(Long),
                 (size_t)(nOpts+1), f))
        return ReportEarlyEof();
      if (need_vbtol
          && !fread((char *)&vbtol, sizeof(real), 1, f))
        return ReportEarlyEof();
      if (!fread((char *)&L2, sizeof(uiolen), 1, f)
          || L != L2)
        return ReportBadFormat();
      have_options = 1;
    }
    else if (L != L1)
      return ReportBadFormat();
  }
  else {         ///////////////// TEXT FORMAT ///////////////
    for(;;) {    ///////////////// SOLVE MESSAGE /////////////
      if (!fgets(buf, sizeof(buf), f)) {
        return ReportEarlyEof();
      }
      for(se = buf; *se; se++)
        if (*se == '\r' && se[1] == '\n') {
          *se = '\n';
          *++se = 0;
          break;
        }
      if (*buf == '\n')
        break;
      n1 = se - buf;
      b1 = buf;
      if (buf[0] == '\b' && bs) {
        n = n1;
        while(--n1 > 0 && *++b1 == '\b');
        nbs += n - n1;
        if (n1 > 0)
          bs = 0;
        else
          continue;
      }
      solve_msg_.append(b1, n1);
    }
    while((j = getc(f)) == '\n' || j == '\r');
    if (j != 'O')     ////////// Check for Options //////////
      ungetc(j,f);
    else {
      if (!fgets(buf, sizeof(buf), f))
        return ReportEarlyEof();
      if (!strncmp(buf, "ptions", 6)) {
        have_options = 1;
        for(j = 0; j < 4; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        nOpts = Options[0];
        if (nOpts < 3 || nOpts > 9)
          goto bad_nOpts;
        if (Options[2] == 3) {
          nOpts -= 2;
          need_vbtol = 1;
        }
        je = (int)(nOpts+5);
        for(j = 4; j < je; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        if (need_vbtol) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          vbtol = strtod(buf,&se);
          if (se == buf)
            return ReportBadLine(buf);
        }
      }
    }
  }

  /* send termination msg */
  if (nbs) {
    // Should not have \b here but...
    auto b=solve_msg_.begin();
    while (solve_msg_.end()!=b && '\b'==*b)
      ++b;
    solve_msg_.erase(solve_msg_.begin(), b);
  }
  if (solve_msg_.size()) {
    if (binary)
      solve_msg_ += "\n";
    Handler().OnSolveMessage(
          solve_msg_.c_str(), nbs);
  }

  if (have_options) {
    z = Options + nOpts + 1;
    internal_rv_ = 996;
    // Send options to Handler:
    typename SOLHandler::AMPLOptions ao;
    ao.options_.assign(Options, Options+nOpts+5);
    ao.has_vbtol_ = need_vbtol;
    ao.vbtol_ = vbtol;
    // Handler says we should stop:
    if (auto rv = Handler().OnAMPLOptions(ao)) {
      internal_rv_ = rv;
      return NLW2_SOLRead_Bad_Options;
    }

    // Some checks.
    j = (int)z[3];
    internal_rv_ = 997;
		if (j > NumVars() || j < 0) {
      serror("Wrong NumVars %d, expected 0..%d: ",
						 j, NumVars());
      return ReportBadFormat();
      }
    j = (int)z[1];
		if (j > NumAlgCons() || j < 0) {
      serror("Wrong NumAlgCons %d, expected 0..%d: ",
						 j, NumAlgCons());
      return ReportBadFormat();
      }

    if (binary) {      // read on for binary
      L1 = j * sizeof(real);
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
    }
  }
	else j = NumAlgCons();

  // Read duals
  if (j) {
    VecReader<double> vr(f, binary, j);
    Handler().OnDualSolution(vr);
    if (!CheckReader( vr, readresult_ ))
      return readresult_;
  }

	i = nsv = have_options ? (int)z[3] : NumVars();
//  objno = ac_->no >= 0 ? 0 : -1;
  sstatus_seen = 0;
  if (binary) {
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();
    L1 = i * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    /* do we have an objno ? */
    if (fread((char *)&L, sizeof(uiolen), 1, f)) {
      if (L != 2*sizeof(Long) && L != sizeof(integer))
        return ReportBadFormat();
      ui = (size_t) L;
      if (fread(Objno, ui, 1, f) != 1
       || fread(&L1, sizeof(uiolen), 1, f) != 1
       || L != L1)
        return ReportBadFormat();
      objno = (int)Objno[0];

      /* Submit objno and solve_code to Handler. */
      Handler().OnObjno(objno);
      Handler().OnSolveCode(Objno[1]);

      if (L == 2*sizeof(integer)) {
        switch(bsufread(f)) {
        case NLW2_SOLRead_Bad_Suffix:
badsuftable:
          serror("Bad suffix in '%s'\n", stub_);
          return NLW2_SOLRead_Bad_Suffix;
        case NLW2_SOLRead_OK:
          break;
        default:
          return readresult_;
        }
      }
      while(fread(&L, sizeof(uiolen), 1, f)) {}
    }
  }
  else {
    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fgets(buf,sizeof(buf), f))
      goto f_done;
    if (strncmp(buf,"objno ",6)) {
bad_objno:
      return ReportBadLine(buf);
      }
    x = strtod(s = buf+6, &se);
    if (se <= s)
      goto bad_objno;
    objno = (int)x;
    x = strtod(s = se, &se);
    if (se <= s)
      goto f_done;
    Objno[1] = (Long)x;

    /* Submit objno and solve_code to Handler. */
    Handler().OnObjno(objno);
    Handler().OnSolveCode(Objno[1]);

    switch(gsufread(f)) {
    case NLW2_SOLRead_Bad_Suffix:
      goto badsuftable;
    case NLW2_SOLRead_OK:
      break;
    default:
      return readresult_;
    }
  }
f_done:
  internal_rv_ = 0;
  return NLW2_SOLRead_OK;
}